

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

char * __thiscall tinyxml2::XMLElement::ParseDeep(XMLElement *this,char *p,StrPair *strPair)

{
  int iVar1;
  char *pcVar2;
  byte bVar3;
  
  bVar3 = *p;
  if (-1 < (char)bVar3) {
    p = p + 1;
    do {
      iVar1 = isspace((uint)bVar3);
      if (iVar1 == 0) {
        if (bVar3 == 0x2f) {
          this->_closingType = 2;
          goto LAB_001782f2;
        }
        break;
      }
      bVar3 = *p;
      p = (char *)((byte *)p + 1);
    } while (-1 < (char)bVar3);
    p = (char *)((byte *)p + -1);
  }
LAB_001782f2:
  pcVar2 = StrPair::ParseName(&(this->super_XMLNode)._value,p);
  if (((this->super_XMLNode)._value._start == (this->super_XMLNode)._value._end) ||
     (pcVar2 = ParseAttributes(this,pcVar2), pcVar2 == (char *)0x0)) {
    pcVar2 = (char *)0x0;
  }
  else if ((*pcVar2 != '\0') && (this->_closingType == 0)) {
    pcVar2 = XMLNode::ParseDeep(&this->super_XMLNode,pcVar2,strPair);
    return pcVar2;
  }
  return pcVar2;
}

Assistant:

char* XMLElement::ParseDeep( char* p, StrPair* strPair )
{
    // Read the element name.
    p = XMLUtil::SkipWhiteSpace( p );

    // The closing element is the </element> form. It is
    // parsed just like a regular element then deleted from
    // the DOM.
    if ( *p == '/' ) {
        _closingType = CLOSING;
        ++p;
    }

    p = _value.ParseName( p );
    if ( _value.Empty() ) {
        return 0;
    }

    p = ParseAttributes( p );
    if ( !p || !*p || _closingType ) {
        return p;
    }

    p = XMLNode::ParseDeep( p, strPair );
    return p;
}